

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

vec4 __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::getData_vec4
          (GLAttributeBuffer *this,size_t ind)

{
  undefined8 uVar1;
  undefined8 uVar2;
  vec4 vVar3;
  RenderDataType RVar4;
  AttributeBuffer *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [64];
  vec<4,_float,_(glm::qualifier)0> vVar9;
  GLAttributeBuffer *unaff_retaddr;
  allocator local_41;
  string local_40 [56];
  size_t in_stack_fffffffffffffff8;
  undefined1 auVar6 [56];
  undefined1 auVar8 [56];
  
  auVar8 = in_ZMM1._8_56_;
  auVar6 = in_ZMM0._8_56_;
  RVar4 = AttributeBuffer::getType(in_RDI);
  if (RVar4 != Vector4Float) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"bad getData type",&local_41);
    exception((string *)unaff_retaddr);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    auVar6 = extraout_var;
    auVar8 = extraout_var_00;
  }
  vVar9 = getData_helper<glm::vec<4,float,(glm::qualifier)0>>
                    (unaff_retaddr,in_stack_fffffffffffffff8);
  auVar7._0_8_ = vVar9._8_8_;
  auVar7._8_56_ = auVar8;
  auVar5._0_8_ = vVar9._0_8_;
  auVar5._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  uVar2 = vmovlpd_avx(auVar7._0_16_);
  vVar3.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar2;
  vVar3.field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)(int)((ulong)uVar2 >> 0x20);
  vVar3.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar1;
  vVar3.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  return vVar3;
}

Assistant:

glm::vec4 GLAttributeBuffer::getData_vec4(size_t ind) {
  if (getType() != RenderDataType::Vector4Float) exception("bad getData type");
  return getData_helper<glm::vec4>(ind);
}